

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O3

bool basisu::write_compressed_texture_file
               (char *pFilename,vector<basisu::vector<basisu::gpu_image>_> *g,bool cubemap_flag)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint8_t *pData;
  ulong uVar5;
  uint8_vec filedata;
  string extension;
  allocator<char> local_99;
  uint8_vec local_98;
  uchar local_88;
  undefined7 uStack_87;
  long *local_78;
  ulong local_70;
  long local_68 [2];
  vector<basisu::vector<basisu::gpu_image>_> *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_58 = g;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pFilename,&local_99);
  iVar3 = std::__cxx11::string::rfind((char)&local_50,0x2f);
  iVar4 = std::__cxx11::string::rfind((char)&local_50,0x2e);
  local_98.m_p = &local_88;
  if (iVar3 < iVar4) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_50,local_48 + (long)local_50);
    std::__cxx11::string::erase((ulong)&local_98,0);
  }
  else {
    local_98.m_size = 0;
    local_98.m_capacity = 0;
    local_88 = '\0';
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_98.m_p,local_98.m_p + local_98._8_8_);
  if (local_70 != 0) {
    uVar5 = 0;
    do {
      plVar1 = local_78;
      iVar3 = tolower((int)*(char *)((long)local_78 + uVar5));
      *(char *)((long)plVar1 + uVar5) = (char)iVar3;
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_70);
  }
  if (local_98.m_p != &local_88) {
    operator_delete(local_98.m_p,CONCAT71(uStack_87,local_88) + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  local_98.m_p = (uint8_t *)0x0;
  local_98.m_size = 0;
  local_98.m_capacity = 0;
  iVar3 = std::__cxx11::string::compare((char *)&local_78);
  if (iVar3 == 0) {
    create_ktx_texture_file(&local_98,local_58,cubemap_flag);
    pData = local_98.m_p;
    if ((local_98._8_8_ & 0xffffffff) == 0) {
      pData = "";
    }
    bVar2 = write_data_to_file(pFilename,pData,local_98._8_8_ & 0xffffffff);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_78);
    if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)&local_78), iVar3 != 0)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_gpu_texture.cpp"
                    ,0x627,
                    "bool basisu::write_compressed_texture_file(const char *, const basisu::vector<gpu_image_vec> &, bool)"
                   );
    }
    bVar2 = false;
  }
  if (local_98.m_p != (uint8_t *)0x0) {
    free(local_98.m_p);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return bVar2;
}

Assistant:

bool write_compressed_texture_file(const char* pFilename, const basisu::vector<gpu_image_vec>& g, bool cubemap_flag)
	{
		std::string extension(string_tolower(string_get_extension(pFilename)));

		uint8_vec filedata;
		if (extension == "ktx")
		{
			if (!create_ktx_texture_file(filedata, g, cubemap_flag))
				return false;
		}
		else if (extension == "pvr")
		{
			// TODO
			return false;
		}
		else if (extension == "dds")
		{
			// TODO
			return false;
		}
		else
		{
			// unsupported texture format
			assert(0);
			return false;
		}

		return basisu::write_vec_to_file(pFilename, filedata);
	}